

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayer.cpp
# Opt level: O1

void __thiscall ILayer::ILayer(ILayer *this,LayerMeta *_meta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  INeuronBuilder *pIVar5;
  float fVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  
  this->_vptr_ILayer = (_func_int **)&PTR__ILayer_00116af0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LayerStats::LayerStats(&this->stats);
  (this->meta).alpha = _meta->alpha;
  paVar2 = &(this->meta).name.field_2;
  (this->meta).name._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (_meta->name)._M_dataplus._M_p;
  paVar1 = &(_meta->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(_meta->name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->meta).name.field_2 + 8) = uVar4;
  }
  else {
    (this->meta).name._M_dataplus._M_p = pcVar3;
    (this->meta).name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->meta).name._M_string_length = (_meta->name)._M_string_length;
  (_meta->name)._M_dataplus._M_p = (pointer)paVar1;
  (_meta->name)._M_string_length = 0;
  (_meta->name).field_2._M_local_buf[0] = '\0';
  pIVar5 = _meta->neuronBuilder;
  (this->meta).size = _meta->size;
  (this->meta).neuronBuilder = pIVar5;
  fVar6 = _meta->zShift;
  (this->meta).width = _meta->width;
  (this->meta).zShift = fVar6;
  std::vector<INeuron_*,_std::allocator<INeuron_*>_>::resize(&this->neurons,(this->meta).size);
  if ((this->meta).size != 0) {
    uVar8 = 0;
    do {
      iVar7 = (**((this->meta).neuronBuilder)->_vptr_INeuronBuilder)();
      (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = (INeuron *)CONCAT44(extraout_var,iVar7);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->meta).size);
  }
  return;
}

Assistant:

ILayer::ILayer( LayerMeta _meta ) : meta( std::move(_meta) )
{
    neurons.resize( meta.size );
    for ( auto idx = 0; idx < meta.size; ++idx ) {
        neurons[idx] = meta.neuronBuilder.build();
    }
}